

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMemoryStressTests.cpp
# Opt level: O0

int __thiscall deqp::egl::MemoryStressTests::init(MemoryStressTests *this,EVP_PKEY_CTX *ctx)

{
  Spec spec_00;
  Spec spec_01;
  Spec spec_02;
  Spec spec_03;
  Spec spec_04;
  Spec spec_05;
  Spec spec_06;
  Spec spec_07;
  Spec spec_08;
  Spec spec_09;
  int extraout_EAX;
  MemoryStressCase *pMVar1;
  Spec spec_9;
  Spec spec_8;
  Spec spec_7;
  Spec spec_6;
  Spec spec_5;
  Spec spec_4;
  Spec spec_3;
  Spec spec_2;
  Spec spec_1;
  Spec spec;
  MemoryStressTests *this_local;
  
  spec.maxWidth = spec.maxWidth & 0xffffff00;
  pMVar1 = (MemoryStressCase *)operator_new(0xd0);
  spec_00._20_4_ = spec.maxWidth;
  spec_00.maxHeight = 0x100;
  spec_00.minHeight = 0x100;
  spec_00.maxWidth = 0x100;
  spec_00.types = OBJECTTYPE_PBUFFER;
  spec_00.minWidth = 0x100;
  MemoryStressCase::MemoryStressCase
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,spec_00,"pbuffer_256x256",
             "PBuffer allocation stress tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  spec_1.maxWidth = CONCAT31(spec_1.maxWidth._1_3_,1);
  pMVar1 = (MemoryStressCase *)operator_new(0xd0);
  spec_01._20_4_ = spec_1.maxWidth;
  spec_01.maxHeight = 0x100;
  spec_01.minHeight = 0x100;
  spec_01.maxWidth = 0x100;
  spec_01.types = OBJECTTYPE_PBUFFER;
  spec_01.minWidth = 0x100;
  MemoryStressCase::MemoryStressCase
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,spec_01,"pbuffer_256x256_use",
             "PBuffer allocation stress tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  spec_2.maxWidth = spec_2.maxWidth & 0xffffff00;
  pMVar1 = (MemoryStressCase *)operator_new(0xd0);
  spec_02._20_4_ = spec_2.maxWidth;
  spec_02.maxHeight = 0x400;
  spec_02.minHeight = 0x400;
  spec_02.maxWidth = 0x400;
  spec_02.types = OBJECTTYPE_PBUFFER;
  spec_02.minWidth = 0x400;
  MemoryStressCase::MemoryStressCase
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,spec_02,"pbuffer_1024x1024",
             "PBuffer allocation stress tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  spec_3.maxWidth = CONCAT31(spec_3.maxWidth._1_3_,1);
  pMVar1 = (MemoryStressCase *)operator_new(0xd0);
  spec_03._20_4_ = spec_3.maxWidth;
  spec_03.maxHeight = 0x400;
  spec_03.minHeight = 0x400;
  spec_03.maxWidth = 0x400;
  spec_03.types = OBJECTTYPE_PBUFFER;
  spec_03.minWidth = 0x400;
  MemoryStressCase::MemoryStressCase
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,spec_03,"pbuffer_1024x1024_use",
             "PBuffer allocation stress tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  spec_4.maxWidth = spec_4.maxWidth & 0xffffff00;
  pMVar1 = (MemoryStressCase *)operator_new(0xd0);
  spec_04._20_4_ = spec_4.maxWidth;
  spec_04.maxHeight = 0x400;
  spec_04.minHeight = 0x40;
  spec_04.maxWidth = 0x400;
  spec_04.types = OBJECTTYPE_PBUFFER;
  spec_04.minWidth = 0x40;
  MemoryStressCase::MemoryStressCase
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,spec_04,"pbuffer",
             "PBuffer allocation stress tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  spec_5.maxWidth = CONCAT31(spec_5.maxWidth._1_3_,1);
  pMVar1 = (MemoryStressCase *)operator_new(0xd0);
  spec_05._20_4_ = spec_5.maxWidth;
  spec_05.maxHeight = 0x400;
  spec_05.minHeight = 0x40;
  spec_05.maxWidth = 0x400;
  spec_05.types = OBJECTTYPE_PBUFFER;
  spec_05.minWidth = 0x40;
  MemoryStressCase::MemoryStressCase
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,spec_05,"pbuffer_use",
             "PBuffer allocation stress tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  spec_6.maxWidth = spec_6.maxWidth & 0xffffff00;
  pMVar1 = (MemoryStressCase *)operator_new(0xd0);
  spec_06._20_4_ = spec_6.maxWidth;
  spec_06.maxHeight = 0x400;
  spec_06.minHeight = 0x400;
  spec_06.maxWidth = 0x400;
  spec_06.types = OBJECTTYPE_CONTEXT;
  spec_06.minWidth = 0x400;
  MemoryStressCase::MemoryStressCase
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,spec_06,"context",
             "Context allocation stress tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  spec_7.maxWidth = CONCAT31(spec_7.maxWidth._1_3_,1);
  pMVar1 = (MemoryStressCase *)operator_new(0xd0);
  spec_07._20_4_ = spec_7.maxWidth;
  spec_07.maxHeight = 0x400;
  spec_07.minHeight = 0x400;
  spec_07.maxWidth = 0x400;
  spec_07.types = OBJECTTYPE_CONTEXT;
  spec_07.minWidth = 0x400;
  MemoryStressCase::MemoryStressCase
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,spec_07,"context_use",
             "Context allocation stress tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  spec_8.maxWidth = spec_8.maxWidth & 0xffffff00;
  pMVar1 = (MemoryStressCase *)operator_new(0xd0);
  spec_08._20_4_ = spec_8.maxWidth;
  spec_08.maxHeight = 0x400;
  spec_08.minHeight = 0x40;
  spec_08.maxWidth = 0x400;
  spec_08.types = OBJECTTYPE_CONTEXT|OBJECTTYPE_PBUFFER;
  spec_08.minWidth = 0x40;
  MemoryStressCase::MemoryStressCase
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,spec_08,"pbuffer_context",
             "PBuffer and context allocation stress tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  spec_9.maxWidth = CONCAT31(spec_9.maxWidth._1_3_,1);
  pMVar1 = (MemoryStressCase *)operator_new(0xd0);
  spec_09._20_4_ = spec_9.maxWidth;
  spec_09.maxHeight = 0x400;
  spec_09.minHeight = 0x40;
  spec_09.maxWidth = 0x400;
  spec_09.types = OBJECTTYPE_CONTEXT|OBJECTTYPE_PBUFFER;
  spec_09.minWidth = 0x40;
  MemoryStressCase::MemoryStressCase
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,spec_09,"pbuffer_context_use",
             "PBuffer and context allocation stress tests");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  return extraout_EAX;
}

Assistant:

void MemoryStressTests::init (void)
{
	// Check small pbuffers 256x256
	{
		MemoryStressCase::Spec spec;

		spec.types		= OBJECTTYPE_PBUFFER;
		spec.minWidth	= 256;
		spec.minHeight	= 256;
		spec.maxWidth	= 256;
		spec.maxHeight	= 256;
		spec.use		= false;

		addChild(new MemoryStressCase(m_eglTestCtx, spec, "pbuffer_256x256", "PBuffer allocation stress tests"));
	}

	// Check small pbuffers 256x256 and use them
	{
		MemoryStressCase::Spec spec;

		spec.types		= OBJECTTYPE_PBUFFER;
		spec.minWidth	= 256;
		spec.minHeight	= 256;
		spec.maxWidth	= 256;
		spec.maxHeight	= 256;
		spec.use		= true;

		addChild(new MemoryStressCase(m_eglTestCtx, spec, "pbuffer_256x256_use", "PBuffer allocation stress tests"));
	}

	// Check big pbuffers 1024x1024
	{
		MemoryStressCase::Spec spec;

		spec.types		= OBJECTTYPE_PBUFFER;
		spec.minWidth	= 1024;
		spec.minHeight	= 1024;
		spec.maxWidth	= 1024;
		spec.maxHeight	= 1024;
		spec.use		= false;

		addChild(new MemoryStressCase(m_eglTestCtx, spec, "pbuffer_1024x1024", "PBuffer allocation stress tests"));
	}

	// Check big pbuffers 1024x1024 and use them
	{
		MemoryStressCase::Spec spec;

		spec.types		= OBJECTTYPE_PBUFFER;
		spec.minWidth	= 1024;
		spec.minHeight	= 1024;
		spec.maxWidth	= 1024;
		spec.maxHeight	= 1024;
		spec.use		= true;

		addChild(new MemoryStressCase(m_eglTestCtx, spec, "pbuffer_1024x1024_use", "PBuffer allocation stress tests"));
	}

	// Check different sized pbuffers
	{
		MemoryStressCase::Spec spec;

		spec.types		= OBJECTTYPE_PBUFFER;
		spec.minWidth	= 64;
		spec.minHeight	= 64;
		spec.maxWidth	= 1024;
		spec.maxHeight	= 1024;
		spec.use		= false;

		addChild(new MemoryStressCase(m_eglTestCtx, spec, "pbuffer", "PBuffer allocation stress tests"));
	}

	// Check different sized pbuffers and use them
	{
		MemoryStressCase::Spec spec;

		spec.types		= OBJECTTYPE_PBUFFER;
		spec.minWidth	= 64;
		spec.minHeight	= 64;
		spec.maxWidth	= 1024;
		spec.maxHeight	= 1024;
		spec.use		= true;

		addChild(new MemoryStressCase(m_eglTestCtx, spec, "pbuffer_use", "PBuffer allocation stress tests"));
	}

	// Check contexts
	{
		MemoryStressCase::Spec spec;

		spec.types		= OBJECTTYPE_CONTEXT;
		spec.minWidth	= 1024;
		spec.minHeight	= 1024;
		spec.maxWidth	= 1024;
		spec.maxHeight	= 1024;
		spec.use		= false;

		addChild(new MemoryStressCase(m_eglTestCtx, spec, "context", "Context allocation stress tests"));
	}

	// Check contexts and use them
	{
		MemoryStressCase::Spec spec;

		spec.types		= OBJECTTYPE_CONTEXT;
		spec.minWidth	= 1024;
		spec.minHeight	= 1024;
		spec.maxWidth	= 1024;
		spec.maxHeight	= 1024;
		spec.use		= true;

		addChild(new MemoryStressCase(m_eglTestCtx, spec, "context_use", "Context allocation stress tests"));
	}

	// Check contexts and pbuffers
	{
		MemoryStressCase::Spec spec;

		spec.types		= (ObjectType)(OBJECTTYPE_PBUFFER|OBJECTTYPE_CONTEXT);
		spec.minWidth	= 64;
		spec.minHeight	= 64;
		spec.maxWidth	= 1024;
		spec.maxHeight	= 1024;
		spec.use		= false;

		addChild(new MemoryStressCase(m_eglTestCtx, spec, "pbuffer_context", "PBuffer and context allocation stress tests"));
	}

	// Check contexts and pbuffers and use
	{
		MemoryStressCase::Spec spec;

		spec.types		= (ObjectType)(OBJECTTYPE_PBUFFER|OBJECTTYPE_CONTEXT);
		spec.minWidth	= 64;
		spec.minHeight	= 64;
		spec.maxWidth	= 1024;
		spec.maxHeight	= 1024;
		spec.use		= true;

		addChild(new MemoryStressCase(m_eglTestCtx, spec, "pbuffer_context_use", "PBuffer and context allocation stress tests"));
	}
}